

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O3

void __thiscall
duckdb::CSVSniffer::DetectDateAndTimeStampFormats
          (CSVSniffer *this,CSVStateMachine *candidate,LogicalType *sql_type,string *separator,
          string_t *dummy_val)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *__x
  ;
  map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
  *pmVar1;
  LogicalTypeId LVar2;
  pointer pcVar3;
  pointer pbVar4;
  DialectOptions *pDVar5;
  CSVStateMachine *candidate_00;
  bool bVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  pointer pbVar11;
  _Base_ptr p_Var12;
  pointer pbVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  save_format_candidates;
  ParseResult result;
  LogicalTypeId local_109;
  CSVStateMachine *local_108;
  long local_100;
  string local_f8;
  pointer local_d8;
  pointer pbStack_d0;
  pointer local_c8;
  map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
  *local_b8;
  pointer local_b0;
  pointer local_a8;
  ParseResult local_a0;
  
  bVar6 = ValidSeparator(separator);
  if (!bVar6) {
    return;
  }
  local_108 = candidate;
  InitializeDateAndTimeStampDetection(this,candidate,separator,sql_type);
  pmVar1 = &this->format_candidates;
  local_a0.data[0]._0_1_ = sql_type->id_;
  pmVar7 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
           ::operator[](pmVar1,(key_type *)&local_a0);
  __x = &pmVar7->format;
  local_a0.tz._M_dataplus._M_p = (pointer)&local_a0.tz.field_2;
  local_a0.tz._M_string_length = 0;
  local_a0.tz.field_2._M_local_buf[0] = '\0';
  local_a0.error_message._M_dataplus._M_p = (pointer)&local_a0.error_message.field_2;
  local_a0.error_message._M_string_length = 0;
  local_a0.error_message.field_2._M_local_buf[0] = '\0';
  local_a0.error_position.index = 0xffffffffffffffff;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_d8,
           &__x->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_a8 = local_d8;
  local_b0 = pbStack_d0;
  local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
  pmVar8 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
           ::at(&this->original_format_candidates,(key_type *)&local_f8);
  p_Var12 = (this->options->dialect_options).date_format._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent;
  p_Var14 = &(this->options->dialect_options).date_format._M_t._M_impl.super__Rb_tree_header.
             _M_header;
  if (p_Var12 != (_Base_ptr)0x0) {
    LVar2 = sql_type->id_;
    p_Var15 = p_Var14;
    do {
      bVar6 = (LogicalTypeId)p_Var12[1]._M_color < LVar2;
      if (!bVar6) {
        p_Var15 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[bVar6];
    } while (p_Var12 != (_Base_ptr)0x0);
    if ((p_Var15 != p_Var14) && ((LogicalTypeId)p_Var15[1]._M_color <= LVar2)) {
      p_Var14 = p_Var15;
    }
  }
  local_100 = (long)(pmVar8->format).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pmVar8->format).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (pmVar7->format).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (pmVar7->format).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = pmVar1;
  if ((pbVar13 != pbVar11) && (*(char *)&p_Var14[1]._M_parent == '\0')) {
    pDVar5 = &local_108->dialect_options;
    do {
      local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
      pmVar9 = ::std::
               map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
               ::operator[](&pDVar5->date_format,(key_type *)&local_f8);
      bVar6 = StrpTimeFormat::Parse
                        (&pmVar9->value,(string_t)(dummy_val->value).pointer,&local_a0,true);
      if (bVar6) {
        local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
        pmVar8 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
                 ::operator[](local_b8,(key_type *)&local_f8);
        pmVar8->had_match = true;
        pbVar13 = (pmVar7->format).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = (pmVar7->format).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        break;
      }
      pbVar13 = (pmVar7->format).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar11 = pbVar13 + -1;
      (pmVar7->format).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
      pcVar3 = pbVar13[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar13[-1].field_2) {
        operator_delete(pcVar3);
        pbVar11 = (pmVar7->format).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pbVar13 = (__x->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar13 != pbVar11) {
        pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::back(__x);
        local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
        SetDateFormat(local_108,pvVar10,(LogicalTypeId *)&local_f8);
        pbVar13 = (pmVar7->format).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = (pmVar7->format).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    } while (pbVar13 != pbVar11);
  }
  pmVar1 = local_b8;
  if ((local_a8 != local_b0) && (pbVar13 == pbVar11)) {
    if ((long)local_b0 - (long)local_a8 == local_100) {
      local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
      pmVar8 = ::std::
               map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
               ::operator[](local_b8,(key_type *)&local_f8);
      if (pmVar8->had_match != true) {
        local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
        pmVar7 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
                 ::operator[](pmVar1,(key_type *)&local_f8);
        pmVar7->initialized = false;
        local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
        pmVar7 = ::std::
                 map<duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::DateTimestampSniffing>_>_>
                 ::operator[](pmVar1,(key_type *)&local_f8);
        candidate_00 = local_108;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pmVar7->format);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,anon_var_dwarf_4ed193b + 9);
        local_109 = sql_type->id_;
        SetDateFormat(candidate_00,&local_f8,&local_109);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        goto LAB_0150ce83;
      }
      pbVar13 = (pmVar7->format).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (pmVar7->format).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    pbVar4 = (pmVar7->format).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pmVar7->format).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_d8;
    (pmVar7->format).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbStack_d0;
    (pmVar7->format).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
    local_d8 = pbVar13;
    pbStack_d0 = pbVar11;
    local_c8 = pbVar4;
    pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::back(__x);
    local_f8._M_dataplus._M_p._0_1_ = sql_type->id_;
    SetDateFormat(local_108,pvVar10,(LogicalTypeId *)&local_f8);
  }
LAB_0150ce83:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.error_message._M_dataplus._M_p != &local_a0.error_message.field_2) {
    operator_delete(local_a0.error_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.tz._M_dataplus._M_p != &local_a0.tz.field_2) {
    operator_delete(local_a0.tz._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CSVSniffer::DetectDateAndTimeStampFormats(CSVStateMachine &candidate, const LogicalType &sql_type,
                                               const string &separator, const string_t &dummy_val) {
	if (!ValidSeparator(separator)) {
		return;
	}
	// If it is the first time running date/timestamp detection we must initialize the format variables
	InitializeDateAndTimeStampDetection(candidate, separator, sql_type);
	// generate date format candidates the first time through
	auto &type_format_candidates = format_candidates[sql_type.id()].format;
	// check all formats and keep the first one that works
	StrpTimeFormat::ParseResult result;
	auto save_format_candidates = type_format_candidates;
	const bool had_format_candidates = !save_format_candidates.empty();
	const bool initial_format_candidates =
	    save_format_candidates.size() == original_format_candidates.at(sql_type.id()).format.size();
	const bool is_set_by_user = options.dialect_options.date_format.find(sql_type.id())->second.IsSetByUser();
	while (!type_format_candidates.empty() && !is_set_by_user) {
		//	avoid using exceptions for flow control...
		auto &current_format = candidate.dialect_options.date_format[sql_type.id()].GetValue();
		if (current_format.Parse(dummy_val, result, true)) {
			format_candidates[sql_type.id()].had_match = true;
			break;
		}
		//	doesn't work - move to the next one
		type_format_candidates.pop_back();
		if (!type_format_candidates.empty()) {
			SetDateFormat(candidate, type_format_candidates.back(), sql_type.id());
		}
	}
	//	if none match, then this is not a value of type sql_type,
	if (type_format_candidates.empty()) {
		//	so restore the candidates that did work.
		//	or throw them out if they were generated by this value.
		if (had_format_candidates) {
			if (initial_format_candidates && !format_candidates[sql_type.id()].had_match) {
				// we reset the whole thing because we tried to sniff the wrong type.
				format_candidates[sql_type.id()].initialized = false;
				format_candidates[sql_type.id()].format.clear();
				SetDateFormat(candidate, "", sql_type.id());
				return;
			}
			type_format_candidates.swap(save_format_candidates);
			SetDateFormat(candidate, type_format_candidates.back(), sql_type.id());
		}
	}
}